

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result * __thiscall
pugi::xml_node::append_buffer
          (xml_parse_result *__return_storage_ptr__,xml_node *this,void *contents,size_t size,
          uint options,xml_encoding encoding)

{
  xml_node_struct *pxVar1;
  xml_allocator *this_00;
  char_t *pcVar2;
  char_t **out_buffer;
  ulong uVar3;
  xml_memory_page *page;
  ulong local_38;
  
  pxVar1 = this->_root;
  if ((pxVar1 == (xml_node_struct *)0x0) || (1 < ((uint)pxVar1->header & 0xf) - 1)) {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_append_invalid_root;
  }
  else {
    if (pxVar1 == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x48d,
                    "xml_document_struct &pugi::impl::(anonymous namespace)::get_document(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    this_00 = *(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8));
    this_00[-4]._root = (xml_memory_page *)((ulong)this_00[-4]._root | 0x40);
    page = (xml_memory_page *)0x0;
    uVar3 = this_00->_busy_size + 0x18;
    if (uVar3 < 0x7fd9) {
      page = this_00->_root;
      out_buffer = (char_t **)((long)&page[1].allocator + this_00->_busy_size);
      this_00->_busy_size = uVar3;
      uVar3 = (ulong)encoding;
    }
    else {
      local_38 = (ulong)encoding;
      out_buffer = (char_t **)
                   impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x18,&page);
      uVar3 = local_38;
    }
    if (out_buffer == (char_t **)0x0) {
      __return_storage_ptr__->offset = 0;
      __return_storage_ptr__->encoding = encoding_auto;
      __return_storage_ptr__->status = status_out_of_memory;
    }
    else {
      *out_buffer = (char_t *)0x0;
      out_buffer[1] = (char_t *)this_00[1]._busy_size;
      this_00[1]._busy_size = (size_t)out_buffer;
      pxVar1 = this->_root;
      pcVar2 = pxVar1->name;
      pxVar1->name = (char_t *)0x0;
      impl::anon_unknown_0::load_buffer_impl
                (__return_storage_ptr__,(xml_document_struct *)(this_00 + -4),pxVar1,contents,size,
                 options,(xml_encoding)uVar3,false,false,out_buffer);
      pxVar1->name = pcVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_node::append_buffer(const void* contents, size_t size, unsigned int options, xml_encoding encoding)
	{
		// append_buffer is only valid for elements/documents
		if (!impl::allow_insert_child(type(), node_element)) return impl::make_parse_result(status_append_invalid_root);

		// get document node
		impl::xml_document_struct* doc = &impl::get_document(_root);

		// disable document_buffer_order optimization since in a document with multiple buffers comparing buffer pointers does not make sense
		doc->header |= impl::xml_memory_page_contents_shared_mask;

		// get extra buffer element (we'll store the document fragment buffer there so that we can deallocate it later)
		impl::xml_memory_page* page = 0;
		impl::xml_extra_buffer* extra = static_cast<impl::xml_extra_buffer*>(doc->allocate_memory(sizeof(impl::xml_extra_buffer) + sizeof(void*), page));
		(void)page;

		if (!extra) return impl::make_parse_result(status_out_of_memory);

	#ifdef PUGIXML_COMPACT
		// align the memory block to a pointer boundary; this is required for compact mode where memory allocations are only 4b aligned
		// note that this requires up to sizeof(void*)-1 additional memory, which the allocation above takes into account
		extra = reinterpret_cast<impl::xml_extra_buffer*>((reinterpret_cast<uintptr_t>(extra) + (sizeof(void*) - 1)) & ~(sizeof(void*) - 1));
	#endif

		// add extra buffer to the list
		extra->buffer = 0;
		extra->next = doc->extra_buffers;
		doc->extra_buffers = extra;

		// name of the root has to be NULL before parsing - otherwise closing node mismatches will not be detected at the top level
		impl::name_null_sentry sentry(_root);

		return impl::load_buffer_impl(doc, _root, const_cast<void*>(contents), size, options, encoding, false, false, &extra->buffer);
	}